

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall rlottie::internal::renderer::Group::applyTrim(Group *this)

{
  bool bVar1;
  int iVar2;
  reference ppOVar3;
  vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
  *in_RDI;
  Object *content;
  reverse_iterator i;
  Trim *in_stack_00000100;
  reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
  *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  Group *in_stack_fffffffffffffff0;
  
  std::
  vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
  ::rbegin(in_RDI);
  while( true ) {
    std::
    vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
    ::rend(in_RDI);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppOVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    iVar2 = (*(*ppOVar3)->_vptr_Object[5])();
    in_stack_ffffffffffffffd7 = (char)iVar2;
    if (in_stack_ffffffffffffffd7 == '\x01') {
      applyTrim(in_stack_fffffffffffffff0);
    }
    else if (in_stack_ffffffffffffffd7 == '\x04') {
      Trim::update(in_stack_00000100);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void renderer::Group::applyTrim()
{
    for (auto i = mContents.rbegin(); i != mContents.rend(); ++i) {
        auto content = (*i);
        switch (content->type()) {
        case renderer::Object::Type::Trim: {
            static_cast<renderer::Trim *>(content)->update();
            break;
        }
        case renderer::Object::Type::Group: {
            static_cast<renderer::Group *>(content)->applyTrim();
            break;
        }
        default:
            break;
        }
    }
}